

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

TestStatus * __thiscall
vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::iterate
          (TestStatus *__return_storage_ptr__,
          FunctionInstance1<vkt::SpirVAssembly::InstanceContext> *this)

{
  Context *pCVar1;
  Function p_Var2;
  InstanceContext IVar3;
  undefined1 in_stack_fffffffffffffef8 [200];
  _Alloc_hider in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  
  pCVar1 = (this->super_TestInstance).m_context;
  p_Var2 = (this->m_args).func;
  SpirVAssembly::InstanceContext::InstanceContext
            ((InstanceContext *)&stack0xffffffffffffff00,&(this->m_args).arg0);
  IVar3.failMessageTemplate._M_string_length = (size_type)in_stack_ffffffffffffffc0._M_p;
  IVar3.moduleMap._M_t._M_impl = (_Rep_type)(_Rep_type)in_stack_fffffffffffffef8._0_48_;
  IVar3.inputColors[0].m_value = in_stack_fffffffffffffef8._48_4_;
  IVar3.inputColors[1].m_value = in_stack_fffffffffffffef8._52_4_;
  IVar3.inputColors[2].m_value = in_stack_fffffffffffffef8._56_4_;
  IVar3.inputColors[3].m_value = in_stack_fffffffffffffef8._60_4_;
  IVar3.outputColors[0].m_value = in_stack_fffffffffffffef8._64_4_;
  IVar3.outputColors[1].m_value = in_stack_fffffffffffffef8._68_4_;
  IVar3.outputColors[2].m_value = in_stack_fffffffffffffef8._72_4_;
  IVar3.outputColors[3].m_value = in_stack_fffffffffffffef8._76_4_;
  IVar3.testCodeFragments._M_t._M_impl = (_Rep_type)(_Rep_type)in_stack_fffffffffffffef8._80_48_;
  IVar3.specConstants._M_t._M_impl = (_Rep_type)(_Rep_type)in_stack_fffffffffffffef8._128_48_;
  IVar3.hasTessellation = (bool)in_stack_fffffffffffffef8[0xb0];
  IVar3._177_3_ = in_stack_fffffffffffffef8._177_3_;
  IVar3.requiredStages = in_stack_fffffffffffffef8._180_4_;
  IVar3.failResult = in_stack_fffffffffffffef8._184_4_;
  IVar3._188_4_ = in_stack_fffffffffffffef8._188_4_;
  IVar3.failMessageTemplate._M_dataplus._M_p = (pointer)in_stack_fffffffffffffef8._192_8_;
  IVar3.failMessageTemplate.field_2._M_allocated_capacity = in_stack_ffffffffffffffc8;
  IVar3.failMessageTemplate.field_2._8_8_ = in_stack_ffffffffffffffd0;
  (*p_Var2)(__return_storage_ptr__,pCVar1,IVar3);
  if (in_stack_ffffffffffffffc0._M_p != &stack0xffffffffffffffd0) {
    operator_delete(in_stack_ffffffffffffffc0._M_p,in_stack_ffffffffffffffd0 + 1);
  }
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&stack0xffffffffffffff80);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&stack0xffffffffffffff50);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::VkShaderStageFlagBits>_>_>_>_>_>
               *)&stack0xffffffffffffff00);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate				(void) { return m_args.func(m_context, m_args.arg0); }